

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O2

void whisper_kv_cache_seq_rm
               (whisper_kv_cache *cache,whisper_seq_id seq_id,whisper_pos p0,whisper_pos p1)

{
  int iVar1;
  pointer pwVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint32_t i;
  ulong uVar6;
  long lVar7;
  int local_34;
  
  uVar4 = cache->size;
  lVar7 = 0;
  if (p0 < 1) {
    p0 = 0;
  }
  uVar6 = 0;
  uVar5 = uVar4;
  local_34 = seq_id;
  do {
    if (uVar4 <= uVar6) {
      if (uVar5 != uVar4) {
        cache->head = uVar5;
      }
      return;
    }
    pwVar2 = (cache->cells).super__Vector_base<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar1 = *(int *)((long)&pwVar2->pos + lVar7);
    if (iVar1 != 0x7fffffff && p0 <= iVar1) {
      if (local_34 < 0) {
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                  ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   ((long)&(pwVar2->seq_id)._M_t._M_impl + lVar7));
      }
      else {
        bVar3 = whisper_kv_cell::has_seq_id
                          ((whisper_kv_cell *)((long)&pwVar2->pos + lVar7),&local_34);
        if (!bVar3) {
          uVar4 = cache->size;
          goto LAB_00148a2c;
        }
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
                  ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   ((long)&(((cache->cells).
                             super__Vector_base<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>.
                             _M_impl.super__Vector_impl_data._M_start)->seq_id)._M_t._M_impl + lVar7
                   ),&local_34);
      }
      pwVar2 = (cache->cells).super__Vector_base<whisper_kv_cell,_std::allocator<whisper_kv_cell>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar4 = cache->size;
      if (*(long *)((long)&(pwVar2->seq_id)._M_t._M_impl + lVar7 + 0x28) == 0) {
        *(undefined4 *)((long)&pwVar2->pos + lVar7) = 0xffffffff;
        if (uVar5 == uVar4) {
          uVar5 = (uint)uVar6;
        }
      }
    }
LAB_00148a2c:
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0x38;
  } while( true );
}

Assistant:

static void whisper_kv_cache_seq_rm(
        struct whisper_kv_cache & cache,
                 whisper_seq_id   seq_id,
                    whisper_pos   p0,
                    whisper_pos   p1) {
    uint32_t new_head = cache.size;

    if (p0 < 0) p0 = 0;
    if (p1 < 0) p1 = std::numeric_limits<whisper_pos>::max();

    for (uint32_t i = 0; i < cache.size; ++i) {
        if (cache.cells[i].pos >= p0 && cache.cells[i].pos < p1) {
            if (seq_id < 0) {
                cache.cells[i].seq_id.clear();
            } else if (cache.cells[i].has_seq_id(seq_id)) {
                cache.cells[i].seq_id.erase(seq_id);
            } else {
                continue;
            }
            if (cache.cells[i].seq_id.empty()) {
                cache.cells[i].pos = -1;
                if (new_head == cache.size) new_head = i;
            }
        }
    }

    // If we freed up a slot, set head to it so searching can start there.
    if (new_head != cache.size) cache.head = new_head;
}